

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

void __thiscall
Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
~ArenaAllocatorBase(ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  InlineCacheFreeListPolicy *_this;
  
  if ((this->super_ArenaData).lockBlockList == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                       ,0x45,"(!lockBlockList)","!lockBlockList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ArenaMemoryTracking::ReportFreeAll(&this->super_Allocator);
  ArenaMemoryTracking::ArenaDestroyed(&this->super_Allocator);
  if (((this->super_ArenaData).pageAllocator)->isClosed == false) {
    ReleasePageMemory(this);
  }
  ReleaseHeapMemory(this);
  if (this->freeList != (void *)0x0) {
    HeapAllocator::Free(&HeapAllocator::Instance,this->freeList,0x100);
  }
  if (this->memoryData != (ArenaMemoryData *)0x0) {
    MemoryProfiler::End(this->name,this->memoryData);
  }
  return;
}

Assistant:

ArenaAllocatorBase<TFreeListPolicy, ObjectAlignmentBitShiftArg, RequireObjectAlignment, MaxObjectSize>::
~ArenaAllocatorBase()
{
    Assert(!lockBlockList);
    ArenaMemoryTracking::ReportFreeAll(this);
    ArenaMemoryTracking::ArenaDestroyed(this);

    if (!pageAllocator->IsClosed())
    {
        ReleasePageMemory();
    }
    ReleaseHeapMemory();
    TFreeListPolicy::Release(this->freeList);
#ifdef PROFILE_MEM
    LogEnd();
#endif

}